

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchMark.cpp
# Opt level: O1

void runBenchMarkWrapper(int howmany,int thread_count)

{
  pointer ptVar1;
  ostream *poVar2;
  long lVar3;
  thread *t;
  pointer ptVar4;
  atomic<int> msg_counter;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  int local_8c;
  string local_88;
  thread local_68;
  undefined4 local_5c;
  vector<std::thread,_std::allocator<std::thread>_> local_58;
  long local_38;
  
  local_8c = howmany;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "+++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++\n",
             0x50);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Wrapper Mode (Rotating mode MT). queue_size = ",0x2e);
  local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x4130000000000000;
  utils::format<double>(&local_88,(double *)&local_58);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_88._M_dataplus._M_p,local_88._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "*******************************************************************************\n",
             0x50);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "\n*******************************************************************************\n",
             0x51);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,thread_count);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," threads sharing same logger, ",0x1e);
  utils::format<int>(&local_88,&local_8c);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_88._M_dataplus._M_p,local_88._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," iterations",0xb);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "*******************************************************************************\n",
             0x50);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,*(char **)(logLevel._M_node + 1),
                      (long)logLevel._M_node[1]._M_parent);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"...\t\t",5);
  std::ostream::flush();
  local_5c = 0;
  local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = std::chrono::_V2::system_clock::now();
  ptVar4 = local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_start;
  ptVar1 = local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (0 < thread_count) {
    do {
      local_68._M_id._M_thread = (id)0;
      local_88._M_dataplus._M_p = (pointer)operator_new(0x18);
      *(undefined ***)local_88._M_dataplus._M_p = &PTR___State_00127b18;
      *(undefined4 **)((long)local_88._M_dataplus._M_p + 8) = &local_5c;
      *(int **)((long)local_88._M_dataplus._M_p + 0x10) = &local_8c;
      std::thread::_M_start_thread(&local_68,&local_88,0);
      if ((long *)local_88._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_88._M_dataplus._M_p + 8))();
      }
      std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                (&local_58,&local_68);
      if (local_68._M_id._M_thread != 0) {
        std::terminate();
      }
      thread_count = thread_count + -1;
      ptVar4 = local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start;
      ptVar1 = local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish;
    } while (thread_count != 0);
  }
  for (; ptVar4 != ptVar1; ptVar4 = ptVar4 + 1) {
    std::thread::join();
  }
  lVar3 = std::chrono::_V2::system_clock::now();
  local_68._M_id._M_thread._0_4_ =
       (int)((double)local_8c / ((double)(lVar3 - local_38) / 1000000000.0));
  utils::format<int>(&local_88,(int *)&local_68);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_88._M_dataplus._M_p,local_88._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"/sec",4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "+++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++\n",
             0x50);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_58);
  return;
}

Assistant:

void runBenchMarkWrapper(int howmany, int thread_count) {
    cout << "\n\n";
    cout << "+++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++\n";
    cout << "Wrapper Mode (Rotating mode MT). queue_size = " << format(std::pow(2, 20)) << "\n";
    cout << "*******************************************************************************\n";
    cout << "\n*******************************************************************************\n";
    cout << thread_count << " threads sharing same logger, " << format(howmany) << " iterations" << endl;
    cout << "*******************************************************************************\n";
    cout << logLevel->first << "...\t\t" << flush;
    std::atomic<int> msg_counter{0};
    vector<thread> threads;
    auto start = system_clock::now();
    for (int t = 0; t < thread_count; ++t)
    {
        threads.push_back(std::thread([&]() {
            for (;;)
            {
                int counter = ++msg_counter;
                if (counter > howmany)
                    break;
                BENChMARK_LOG("Hello logger: msg number {}", counter);
            }
        }));
    }

    for (auto &t : threads)
    {
        t.join();
    };

    auto delta = system_clock::now() - start;
    auto delta_d = duration_cast<duration<double>>(delta).count();
    cout << format(int(howmany / delta_d)) << "/sec" << endl;
    cout << "+++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++\n";
}